

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

Node * __thiscall anon_unknown.dwarf_24939c::Db::parseLocalName(Db *this,NameState *State)

{
  bool bVar1;
  char *pcVar2;
  LocalName *pLVar3;
  Node *local_50;
  Node *Entity;
  Node *N;
  NameType *local_30;
  Node *local_28;
  Node *Encoding;
  NameState *State_local;
  Db *this_local;
  
  Encoding = (Node *)State;
  State_local = (NameState *)this;
  bVar1 = consumeIf(this,'Z');
  if (((!bVar1) || (local_28 = parseEncoding(this), local_28 == (Node *)0x0)) ||
     (bVar1 = consumeIf(this,'E'), !bVar1)) {
    return (Node *)0x0;
  }
  bVar1 = consumeIf(this,'s');
  if (bVar1) {
    pcVar2 = parse_discriminator(this->First,this->Last);
    this->First = pcVar2;
    local_30 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[15]>
                         ((Db *)this,(char (*) [15])"string literal");
    pLVar3 = (anonymous_namespace)::Db::
             make<(anonymous_namespace)::LocalName,(anonymous_namespace)::Node*&,(anonymous_namespace)::NameType*>
                       ((Db *)this,&local_28,&local_30);
    return &pLVar3->super_Node;
  }
  bVar1 = consumeIf(this,'d');
  if (bVar1) {
    _N = parseNumber(this,true);
    bVar1 = consumeIf(this,'_');
    if (!bVar1) {
      return (Node *)0x0;
    }
    Entity = parseName(this,(NameState *)Encoding);
    if (Entity != (Node *)0x0) {
      pLVar3 = (anonymous_namespace)::Db::
               make<(anonymous_namespace)::LocalName,(anonymous_namespace)::Node*&,(anonymous_namespace)::Node*&>
                         ((Db *)this,&local_28,&Entity);
      return &pLVar3->super_Node;
    }
    return (Node *)0x0;
  }
  local_50 = parseName(this,(NameState *)Encoding);
  if (local_50 != (Node *)0x0) {
    pcVar2 = parse_discriminator(this->First,this->Last);
    this->First = pcVar2;
    pLVar3 = (anonymous_namespace)::Db::
             make<(anonymous_namespace)::LocalName,(anonymous_namespace)::Node*&,(anonymous_namespace)::Node*&>
                       ((Db *)this,&local_28,&local_50);
    return &pLVar3->super_Node;
  }
  return (Node *)0x0;
}

Assistant:

Node *Db::parseLocalName(NameState *State) {
  if (!consumeIf('Z'))
    return nullptr;
  Node *Encoding = parseEncoding();
  if (Encoding == nullptr || !consumeIf('E'))
    return nullptr;

  if (consumeIf('s')) {
    First = parse_discriminator(First, Last);
    return make<LocalName>(Encoding, make<NameType>("string literal"));
  }

  if (consumeIf('d')) {
    parseNumber(true);
    if (!consumeIf('_'))
      return nullptr;
    Node *N = parseName(State);
    if (N == nullptr)
      return nullptr;
    return make<LocalName>(Encoding, N);
  }

  Node *Entity = parseName(State);
  if (Entity == nullptr)
    return nullptr;
  First = parse_discriminator(First, Last);
  return make<LocalName>(Encoding, Entity);
}